

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_scalar_split(secp256k1_scalar *full)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  secp256k1_scalar *r;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  secp256k1_scalar s1;
  secp256k1_scalar slam;
  uchar zero [32];
  secp256k1_scalar s;
  uchar tmp [32];
  secp256k1_scalar local_f8;
  secp256k1_scalar local_d8;
  byte local_b8 [32];
  secp256k1_scalar local_98;
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  local_b8[0x10] = 0;
  local_b8[0x11] = 0;
  local_b8[0x12] = 0;
  local_b8[0x13] = 0;
  local_b8[0x14] = 0;
  local_b8[0x15] = 0;
  local_b8[0x16] = 0;
  local_b8[0x17] = 0;
  local_b8[0x18] = 0;
  local_b8[0x19] = 0;
  local_b8[0x1a] = 0;
  local_b8[0x1b] = 0;
  local_b8[0x1c] = 0;
  local_b8[0x1d] = 0;
  local_b8[0x1e] = 0;
  local_b8[0x1f] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  secp256k1_scalar_split_lambda(&local_f8,&local_d8,full);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d8.d[0];
  uVar25 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar3,8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar25;
  local_78 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar3,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d8.d[1];
  auVar4 = ZEXT816(0xdf02967c1b23bd72) * auVar4;
  uVar31 = SUB168(auVar4 + auVar19,0);
  uVar36 = SUB168(auVar4 + auVar19,8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d8.d[0];
  uVar26 = SUB168(ZEXT816(0x122e22ea20816678) * auVar5,8);
  uVar22 = SUB168(ZEXT816(0x122e22ea20816678) * auVar5,0);
  local_70 = uVar31 + uVar22;
  uVar22 = (ulong)CARRY8(uVar31,uVar22);
  uVar31 = uVar36 + uVar26;
  uVar37 = uVar31 + uVar22;
  uVar38 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar25,auVar4._0_8_)) +
           (ulong)(CARRY8(uVar36,uVar26) || CARRY8(uVar31,uVar22));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_d8.d[2];
  uVar27 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar6,8);
  uVar22 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar6,0);
  uVar25 = uVar37 + uVar22;
  uVar22 = (ulong)CARRY8(uVar37,uVar22);
  uVar26 = uVar38 + uVar27;
  uVar39 = uVar26 + uVar22;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d8.d[1];
  uVar28 = SUB168(ZEXT816(0x122e22ea20816678) * auVar7,8);
  uVar31 = SUB168(ZEXT816(0x122e22ea20816678) * auVar7,0);
  uVar37 = uVar25 + uVar31;
  uVar31 = (ulong)CARRY8(uVar25,uVar31);
  uVar36 = uVar39 + uVar28;
  uVar40 = uVar36 + uVar31;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_d8.d[0];
  uVar29 = SUB168(ZEXT816(0xa5261c028812645a) * auVar8,8);
  uVar25 = SUB168(ZEXT816(0xa5261c028812645a) * auVar8,0);
  local_68 = uVar37 + uVar25;
  uVar25 = (ulong)CARRY8(uVar37,uVar25);
  uVar37 = uVar40 + uVar29;
  uVar41 = uVar37 + uVar25;
  uVar32 = (ulong)(CARRY8(uVar38,uVar27) || CARRY8(uVar26,uVar22)) +
           (ulong)(CARRY8(uVar39,uVar28) || CARRY8(uVar36,uVar31)) +
           (ulong)(CARRY8(uVar40,uVar29) || CARRY8(uVar37,uVar25));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_d8.d[3];
  uVar29 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar9,8);
  uVar22 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar9,0);
  uVar25 = uVar41 + uVar22;
  uVar22 = (ulong)CARRY8(uVar41,uVar22);
  uVar36 = uVar32 + uVar29;
  uVar41 = uVar36 + uVar22;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_d8.d[2];
  uVar38 = SUB168(ZEXT816(0x122e22ea20816678) * auVar10,8);
  uVar31 = SUB168(ZEXT816(0x122e22ea20816678) * auVar10,0);
  uVar26 = uVar25 + uVar31;
  uVar31 = (ulong)CARRY8(uVar25,uVar31);
  uVar37 = uVar41 + uVar38;
  uVar33 = uVar37 + uVar31;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_d8.d[1];
  uVar39 = SUB168(ZEXT816(0xa5261c028812645a) * auVar11,8);
  uVar25 = SUB168(ZEXT816(0xa5261c028812645a) * auVar11,0);
  uVar28 = uVar26 + uVar25;
  uVar25 = (ulong)CARRY8(uVar26,uVar25);
  uVar27 = uVar33 + uVar39;
  uVar34 = uVar27 + uVar25;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_d8.d[0];
  uVar40 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar12,8);
  uVar26 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar12,0);
  local_60 = uVar28 + uVar26;
  uVar26 = (ulong)CARRY8(uVar28,uVar26);
  uVar28 = uVar34 + uVar40;
  uVar35 = uVar28 + uVar26;
  uVar38 = (ulong)(CARRY8(uVar32,uVar29) || CARRY8(uVar36,uVar22)) +
           (ulong)(CARRY8(uVar41,uVar38) || CARRY8(uVar37,uVar31)) +
           (ulong)(CARRY8(uVar33,uVar39) || CARRY8(uVar27,uVar25)) +
           (ulong)(CARRY8(uVar34,uVar40) || CARRY8(uVar28,uVar26));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_d8.d[3];
  uVar27 = SUB168(ZEXT816(0x122e22ea20816678) * auVar13,8);
  uVar22 = SUB168(ZEXT816(0x122e22ea20816678) * auVar13,0);
  uVar25 = uVar35 + uVar22;
  uVar22 = (ulong)CARRY8(uVar35,uVar22);
  uVar26 = uVar38 + uVar27;
  uVar39 = uVar26 + uVar22;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_d8.d[2];
  uVar28 = SUB168(ZEXT816(0xa5261c028812645a) * auVar14,8);
  uVar31 = SUB168(ZEXT816(0xa5261c028812645a) * auVar14,0);
  uVar37 = uVar25 + uVar31;
  uVar31 = (ulong)CARRY8(uVar25,uVar31);
  uVar36 = uVar39 + uVar28;
  uVar40 = uVar36 + uVar31;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_d8.d[1];
  uVar29 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar15,8);
  uVar25 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar15,0);
  local_58 = uVar37 + uVar25;
  uVar25 = (ulong)CARRY8(uVar37,uVar25);
  uVar37 = uVar40 + uVar29;
  uVar32 = uVar37 + uVar25;
  uVar27 = (ulong)(CARRY8(uVar38,uVar27) || CARRY8(uVar26,uVar22)) +
           (ulong)(CARRY8(uVar39,uVar28) || CARRY8(uVar36,uVar31)) +
           (ulong)(CARRY8(uVar40,uVar29) || CARRY8(uVar37,uVar25));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_d8.d[3];
  uVar36 = SUB168(ZEXT816(0xa5261c028812645a) * auVar16,8);
  uVar22 = SUB168(ZEXT816(0xa5261c028812645a) * auVar16,0);
  uVar26 = uVar32 + uVar22;
  uVar22 = (ulong)CARRY8(uVar32,uVar22);
  uVar25 = uVar27 + uVar36;
  uVar28 = uVar25 + uVar22;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_d8.d[2];
  uVar37 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar17,8);
  uVar31 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar17,0);
  local_50 = uVar26 + uVar31;
  uVar31 = (ulong)CARRY8(uVar26,uVar31);
  uVar26 = uVar28 + uVar37;
  local_48._8_8_ =
       (ulong)(CARRY8(uVar27,uVar36) || CARRY8(uVar25,uVar22)) +
       (ulong)(CARRY8(uVar28,uVar37) || CARRY8(uVar26,uVar31));
  local_48._0_8_ = uVar26 + uVar31;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_d8.d[3];
  local_48 = ZEXT816(0x5363ad4cc05c30e0) * auVar18 + local_48;
  r = &local_98;
  secp256k1_scalar_reduce_512(r,&local_78);
  secp256k1_scalar_add(r,r,&local_f8);
  if ((((local_98.d[0] == full->d[0]) && (local_98.d[1] == full->d[1])) &&
      (local_98.d[2] == full->d[2])) && (local_98.d[3] == full->d[3])) {
    uVar20 = -(int)((long)local_f8.d[3] >> 0x3f);
    uVar24 = uVar20 ^ 1;
    uVar30 = uVar24;
    if (local_f8.d[2] == 0xffffffffffffffff) {
      uVar30 = 0;
    }
    if (0x5d576e7357a4501c < local_f8.d[1]) {
      uVar24 = 0;
    }
    uVar24 = (uVar24 | uVar30 | local_f8.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar30 = 0;
    if (0xdfe92f46681b20a0 < local_f8.d[0]) {
      uVar30 = uVar24;
    }
    if (0x5d576e7357a4501d < local_f8.d[1]) {
      uVar30 = uVar24;
    }
    if (uVar30 != 0 || uVar20 != 0) {
      secp256k1_scalar_negate(&local_f8,&local_f8);
    }
    uVar20 = -(int)((long)local_d8.d[3] >> 0x3f);
    uVar24 = uVar20 ^ 1;
    uVar30 = uVar24;
    if (local_d8.d[2] == 0xffffffffffffffff) {
      uVar30 = 0;
    }
    if (0x5d576e7357a4501c < local_d8.d[1]) {
      uVar24 = 0;
    }
    uVar24 = (uVar24 | uVar30 | local_d8.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar30 = 0;
    if (0xdfe92f46681b20a0 < local_d8.d[0]) {
      uVar30 = uVar24;
    }
    if (0x5d576e7357a4501d < local_d8.d[1]) {
      uVar30 = uVar24;
    }
    if (uVar30 != 0 || uVar20 != 0) {
      secp256k1_scalar_negate(&local_d8,&local_d8);
    }
    secp256k1_scalar_get_b32((uchar *)&local_78,&local_f8);
    lVar23 = 0;
    uVar22 = extraout_RAX;
    do {
      uVar31 = uVar22 & 0xffffffff;
      bVar1 = local_b8[lVar23];
      r = (secp256k1_scalar *)(ulong)bVar1;
      bVar2 = *(byte *)((long)&local_78 + lVar23);
      uVar22 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar22 = uVar31;
      }
      iVar21 = (int)uVar22;
      if (bVar1 != bVar2) goto LAB_001677ac;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0x10);
    iVar21 = 0;
LAB_001677ac:
    if (iVar21 == 0) {
      secp256k1_scalar_get_b32((uchar *)&local_78,&local_d8);
      lVar23 = 0;
      uVar22 = extraout_RAX_00;
      do {
        uVar31 = uVar22 & 0xffffffff;
        bVar1 = local_b8[lVar23];
        r = (secp256k1_scalar *)(ulong)bVar1;
        bVar2 = *(byte *)((long)&local_78 + lVar23);
        uVar22 = (ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          uVar22 = uVar31;
        }
        iVar21 = (int)uVar22;
        if (bVar1 != bVar2) goto LAB_001677ea;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x10);
      iVar21 = 0;
LAB_001677ea:
      if (iVar21 == 0) {
        return;
      }
      goto LAB_0016780a;
    }
  }
  else {
    test_scalar_split_cold_3();
  }
  test_scalar_split_cold_1();
LAB_0016780a:
  test_scalar_split_cold_2();
  *(int *)r->d = (int)r->d[0] + -1;
  return;
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}